

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

bool __thiscall indk::Event::doWait(Event *this)

{
  bool bVar1;
  undefined1 local_28 [8];
  unique_lock<std::mutex> oNotifierLock;
  bool bRet;
  Event *this_local;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->m_oMutex);
  std::condition_variable::wait((unique_lock *)&this->m_oConditionVariable);
  bVar1 = (bool)(this->m_bEvent & 1);
  this->m_bEvent = false;
  oNotifierLock._15_1_ = bVar1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return bVar1;
}

Assistant:

bool indk::Event::doWait() {
    bool bRet;
    std::unique_lock<std::mutex> oNotifierLock(m_oMutex);
    m_oConditionVariable.wait(oNotifierLock);
    bRet = m_bEvent;
    m_bEvent = false;
    return bRet;
}